

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lyplg_ext_pfree_instance_substatements(ly_ctx *ctx,lysp_ext_substmt *substmts)

{
  ushort uVar1;
  ly_stmt lVar2;
  lysp_node *plVar3;
  uint64_t c__;
  ulong uVar4;
  lysp_node *node;
  lysp_type **type_p;
  void **ppvVar5;
  void *pvVar6;
  lysp_ext_substmt *plVar7;
  void **ppvVar8;
  long lVar9;
  lysf_ctx local_50;
  
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  if (substmts != (lysp_ext_substmt *)0x0) {
    ppvVar8 = (void **)0x0;
    local_50.ctx = ctx;
LAB_0015a6cb:
    if (ppvVar8 < substmts[-1].storage_p) {
      ppvVar5 = substmts[(long)ppvVar8].storage_p;
      if (ppvVar5 != (void **)0x0) {
        plVar7 = substmts + (long)ppvVar8;
        lVar2 = plVar7->stmt;
        if ((((((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
               ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0))
              || (lVar2 == LY_STMT_AUGMENT)) ||
             (((lVar2 == LY_STMT_CASE || (lVar2 == LY_STMT_CHOICE)) ||
              ((lVar2 == LY_STMT_CONTAINER ||
               ((lVar2 == LY_STMT_GROUPING || (lVar2 == LY_STMT_LEAF)))))))) ||
            (lVar2 == LY_STMT_LEAF_LIST)) || ((lVar2 == LY_STMT_LIST || (lVar2 == LY_STMT_USES)))) {
          plVar3 = (lysp_node *)*ppvVar5;
          while (node = plVar3, node != (lysp_node *)0x0) {
            plVar3 = node->next;
            uVar1 = node->nodetype;
            lysp_node_free(&local_50,node);
            if ((uVar1 & 0x3000) != 0) {
              free(node);
            }
          }
          *plVar7->storage_p = (void *)0x0;
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_ARGUMENT) {
LAB_0015a9e0:
          lydict_remove(ctx,(char *)*ppvVar5);
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_BASE) {
          uVar4 = 0;
          while (pvVar6 = **ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lydict_remove(ctx,(char *)((long)pvVar6 + uVar4));
            uVar4 = uVar4 + 1;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_BELONGS_TO) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_BIT) {
LAB_0015aabf:
          lysp_type_enum_free(&local_50,(lysp_type_enum *)*ppvVar5);
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_CONFIG) goto LAB_0015acdf;
        if (lVar2 == LY_STMT_CONTACT) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_DEFAULT) {
LAB_0015aa79:
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_qname_free(ctx,(lysp_qname *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x18;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_DEVIATE) {
          lysp_deviate_free(&local_50,(lysp_deviate *)*ppvVar5);
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_DEVIATION) {
          lysp_deviation_free(&local_50,(lysp_deviation *)*ppvVar5);
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_ENUM) goto LAB_0015aabf;
        if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE)) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_EXTENSION) {
          lysp_ext_free(&local_50,(lysp_ext *)*ppvVar5);
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_ext_instance_free(&local_50,(lysp_ext_instance *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x70;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_FEATURE) {
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_feature_free(&local_50,(lysp_feature *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x40;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_FRACTION_DIGITS) goto LAB_0015acdf;
        if (lVar2 == LY_STMT_IDENTITY) {
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_ident_free(&local_50,(lysp_ident *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x38;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_IF_FEATURE) goto LAB_0015aa79;
        if (lVar2 == LY_STMT_IMPORT) {
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_import_free(&local_50,(lysp_import *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x40;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_INCLUDE) {
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_include_free(&local_50,(lysp_include *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x38;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_KEY) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_LENGTH) goto LAB_0015aa45;
        if (((lVar2 == LY_STMT_MANDATORY) || (lVar2 == LY_STMT_MAX_ELEMENTS)) ||
           (lVar2 == LY_STMT_MIN_ELEMENTS)) goto LAB_0015acdf;
        if (lVar2 == LY_STMT_MODIFIER) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_MODULE) {
LAB_0015aaae:
          lysp_module_free(&local_50,(lysp_module *)*ppvVar5);
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_MUST) goto LAB_0015aa45;
        if (lVar2 == LY_STMT_NAMESPACE) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_ORDERED_BY) goto LAB_0015acdf;
        if (lVar2 == LY_STMT_ORGANIZATION) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_PATH) {
          lyxp_expr_free(ctx,(lyxp_expr *)*ppvVar5);
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_PATTERN) {
LAB_0015aa45:
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_restr_free(&local_50,(lysp_restr *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x40;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_POSITION) goto LAB_0015acdf;
        if ((lVar2 == LY_STMT_PREFIX) || (lVar2 == LY_STMT_PRESENCE)) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_RANGE) goto LAB_0015aa45;
        if (lVar2 == LY_STMT_REFERENCE) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_REFINE) {
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_refine_free(&local_50,(lysp_refine *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x50;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_REQUIRE_INSTANCE) goto LAB_0015acdf;
        if (lVar2 == LY_STMT_REVISION) {
          lVar9 = 0;
          uVar4 = 0;
          while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
            if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
            lysp_revision_free(&local_50,(lysp_revision *)((long)pvVar6 + lVar9));
            uVar4 = uVar4 + 1;
            lVar9 = lVar9 + 0x28;
            ppvVar5 = plVar7->storage_p;
          }
          goto LAB_0015acdf;
        }
        if (lVar2 == LY_STMT_REVISION_DATE) goto LAB_0015a9e0;
        if (lVar2 == LY_STMT_STATUS) goto LAB_0015acdf;
        if (lVar2 == LY_STMT_SUBMODULE) goto LAB_0015aaae;
        if (lVar2 != LY_STMT_TYPE) {
          if (lVar2 != LY_STMT_YIN_ELEMENT) {
            if (lVar2 == LY_STMT_UNIQUE) goto LAB_0015aa79;
            if (lVar2 == LY_STMT_UNITS) goto LAB_0015a9e0;
            if (lVar2 != LY_STMT_VALUE) {
              if (lVar2 == LY_STMT_WHEN) {
                lVar9 = 0;
                uVar4 = 0;
                while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
                  if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
                  lysp_when_free(&local_50,(lysp_when *)((long)pvVar6 + lVar9));
                  uVar4 = uVar4 + 1;
                  lVar9 = lVar9 + 0x20;
                  ppvVar5 = plVar7->storage_p;
                }
              }
              else if (lVar2 != LY_STMT_YANG_VERSION) {
                if (lVar2 == LY_STMT_TYPEDEF) {
                  lVar9 = 0;
                  uVar4 = 0;
                  while (pvVar6 = *ppvVar5, pvVar6 != (void *)0x0) {
                    if (*(ulong *)((long)pvVar6 + -8) <= uVar4) goto LAB_0015acd3;
                    lysp_tpdf_free(&local_50,(lysp_tpdf *)((long)pvVar6 + lVar9));
                    uVar4 = uVar4 + 1;
                    lVar9 = lVar9 + 0xb0;
                    ppvVar5 = plVar7->storage_p;
                  }
                }
                else {
                  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
                         ,0x602);
                }
              }
            }
          }
          goto LAB_0015acdf;
        }
        lysp_type_free(&local_50,(lysp_type *)*ppvVar5);
        pvVar6 = *ppvVar5;
        goto LAB_0015acda;
      }
      goto LAB_0015acdf;
    }
    free(&substmts[-1].storage_p);
  }
  return;
LAB_0015acd3:
  pvVar6 = (void *)((long)pvVar6 + -8);
LAB_0015acda:
  free(pvVar6);
LAB_0015acdf:
  ppvVar8 = (void **)((long)ppvVar8 + 1);
  goto LAB_0015a6cb;
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_pfree_instance_substatements(const struct ly_ctx *ctx, struct lysp_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_GROUPING:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_USES: {
            struct lysp_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysp_node_free(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_BASE:
            /* multiple strings */
            FREE_ARRAY(ctx, **(const char ***)substmts[u].storage_p, lydict_remove);
            break;

        case LY_STMT_BIT:
        case LY_STMT_ENUM:
            /* single enum */
            lysp_type_enum_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATE:
            /* single deviate */
            lysp_deviate_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATION:
            /* single deviation */
            lysp_deviation_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION:
            /* single extension */
            lysp_ext_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION_INSTANCE:
            /* multiple extension instances */
            FREE_ARRAY(&fctx, *(struct lysp_ext_instance **)substmts[u].storage_p, lysp_ext_instance_free);
            break;

        case LY_STMT_FEATURE:
            /* multiple features */
            FREE_ARRAY(&fctx, *(struct lysp_feature **)substmts[u].storage_p, lysp_feature_free);
            break;

        case LY_STMT_IDENTITY:
            /* multiple identities */
            FREE_ARRAY(&fctx, *(struct lysp_ident **)substmts[u].storage_p, lysp_ident_free);
            break;

        case LY_STMT_IMPORT:
            /* multiple imports */
            FREE_ARRAY(&fctx, *(struct lysp_import **)substmts[u].storage_p, lysp_import_free);
            break;

        case LY_STMT_INCLUDE:
            /* multiple includes */
            FREE_ARRAY(&fctx, *(struct lysp_include **)substmts[u].storage_p, lysp_include_free);
            break;

        case LY_STMT_REFINE:
            /* multiple refines */
            FREE_ARRAY(&fctx, *(struct lysp_refine **)substmts[u].storage_p, lysp_refine_free);
            break;

        case LY_STMT_REVISION:
            /* multiple revisions */
            FREE_ARRAY(&fctx, *(struct lysp_revision **)substmts[u].storage_p, lysp_revision_free);
            break;

        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PREFIX:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_UNITS:
            /* single string */
            lydict_remove(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_LENGTH:
        case LY_STMT_MUST:
        case LY_STMT_PATTERN:
        case LY_STMT_RANGE:
            /* multiple restrictions */
            FREE_ARRAY(&fctx, *(struct lysp_restr **)substmts[u].storage_p, lysp_restr_free);
            break;

        case LY_STMT_WHEN:
            /* multiple whens */
            FREE_ARRAY(&fctx, *(struct lysp_when **)substmts[u].storage_p, lysp_when_free);
            break;

        case LY_STMT_PATH:
            /* single expression */
            lyxp_expr_free(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEFAULT:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_UNIQUE:
            /* multiple qnames */
            FREE_ARRAY(ctx, *(struct lysp_qname **)substmts[u].storage_p, lysp_qname_free);
            break;

        case LY_STMT_TYPEDEF:
            /* multiple typedefs */
            FREE_ARRAY(&fctx, *(struct lysp_tpdf **)substmts[u].storage_p, lysp_tpdf_free);
            break;

        case LY_STMT_TYPE: {
            /* single type */
            struct lysp_type **type_p = (struct lysp_type **)substmts[u].storage_p;

            lysp_type_free(&fctx, *type_p);
            free(*type_p);
            break;
        }
        case LY_STMT_MODULE:
        case LY_STMT_SUBMODULE:
            /* single (sub)module */
            lysp_module_free(&fctx, *substmts[u].storage_p);
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}